

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

void __thiscall
booster::aio::stream_socket::async_read_some
          (stream_socket *this,mutable_buffer *buffer,io_handler *h)

{
  bool bVar1;
  size_t n;
  reader_some *this_00;
  io_service *this_01;
  atomic_counter *this_02;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> local_50;
  callback<void_(const_std::error_code_&)> local_48;
  pointer reader;
  error_code e;
  
  bVar1 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (bVar1) {
    e._M_value = 0;
    e._M_cat = (error_category *)std::_V2::system_category();
    n = read_some(this,buffer,&e);
    if ((e._M_value != 0) && (bVar1 = basic_io_device::would_block(&e), bVar1)) {
      this_00 = (reader_some *)operator_new(0x50);
      callable<void_(const_std::error_code_&)>::callable
                ((callable<void_(const_std::error_code_&)> *)this_00);
      (this_00->super_callable<void_(const_std::error_code_&)>).super_refcounted._vptr_refcounted =
           (_func_int **)&PTR__reader_some_001d90e0;
      intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
      intrusive_ptr(&(this_00->h).call_ptr,&h->call_ptr);
      buffer_impl<char_*>::buffer_impl
                (&(this_00->buf).super_buffer_impl<char_*>,&buffer->super_buffer_impl<char_*>);
      this_00->sock = this;
      this_02 = &(this_00->super_callable<void_(const_std::error_code_&)>).super_refcounted.refs_;
      reader.p_ = this_00;
      atomic_counter::inc(this_02);
      local_50.p_ = this_00;
      atomic_counter::inc(this_02);
      callback<void_(const_std::error_code_&)>::
      callback<booster::aio::(anonymous_namespace)::reader_some>(&local_48,&local_50);
      basic_io_device::on_readable((basic_io_device *)this,&local_48);
      intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                (&local_48.call_ptr);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some>::~intrusive_ptr(&local_50);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some>::~intrusive_ptr(&reader);
      return;
    }
    this_01 = basic_io_device::get_io_service((basic_io_device *)this);
    io_service::post(this_01,h,&e,n);
  }
  return;
}

Assistant:

void stream_socket::async_read_some(mutable_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;
	#ifdef BOOSTER_AIO_FORCE_POLL
	reader_some::pointer reader(new reader_some(h,buffer,this));
	on_readable(reader);
	#else
	system::error_code e;
	size_t n = read_some(buffer,e);
	if(e &&  would_block(e)) {
		reader_some::pointer reader(new reader_some(h,buffer,this));
		on_readable(reader);
	}
	else {
		get_io_service().post(h,e,n);
	}
	#endif
}